

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool __thiscall
tinyusdz::GeomPrimvar::flatten_with_indices<tinyusdz::value::quath>
          (GeomPrimvar *this,double t,
          vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *dest,
          TimeSampleInterpolationType tinterp,string *err)

{
  bool bVar1;
  uint32_t tyid;
  AttrMeta *pAVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_240;
  string local_220;
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8;
  string local_1b8 [32];
  string local_198;
  allocator local_171;
  string local_170 [32];
  fmt local_150 [32];
  error_type *local_130;
  string *err_msg;
  undefined1 local_120 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> expanded_val;
  undefined1 local_d8 [8];
  vector<int,_std::allocator<int>_> indices;
  undefined1 local_b8 [4];
  uint32_t elementSize;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> value;
  allocator local_79;
  string local_78 [32];
  fmt local_58 [32];
  string *local_38;
  string *err_local;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *pvStack_28;
  TimeSampleInterpolationType tinterp_local;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *dest_local;
  double t_local;
  GeomPrimvar *this_local;
  
  local_38 = err;
  err_local._4_4_ = tinterp;
  pvStack_28 = dest;
  dest_local = (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)t;
  t_local = (double)this;
  if (dest == (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"Output value is nullptr.");
    }
    this_local._7_1_ = 0;
    goto LAB_00741012;
  }
  bVar1 = Attribute::has_timesamples(&this->_attr);
  if ((bVar1) || (bVar1 = Attribute::has_value(&this->_attr), bVar1)) {
    tyid = Attribute::type_id(&this->_attr);
    bVar1 = IsSupportedGeomPrimvarType(tyid);
    if (!bVar1) {
      if (local_38 != (string *)0x0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_78,"Unsupported type for GeomPrimvar. type = `{}`",&local_79);
        Attribute::type_name_abi_cxx11_
                  ((string *)
                   &value.
                    super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->_attr);
        fmt::format<std::__cxx11::string>
                  (local_58,(string *)local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &value.
                    super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::operator+=((string *)local_38,(string *)local_58);
        ::std::__cxx11::string::~string((string *)local_58);
        ::std::__cxx11::string::~string
                  ((string *)
                   &value.
                    super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::~string(local_78);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
      }
      this_local._7_1_ = 0;
      goto LAB_00741012;
    }
    ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::vector
              ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)local_b8);
    bVar1 = Attribute::
            get_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                      (&this->_attr,(double)dest_local,
                       (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                       local_b8,err_local._4_4_);
    if (bVar1) {
      pAVar2 = Attribute::metas(&this->_attr);
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           nonstd::optional_lite::optional<unsigned_int>::value_or<int>
                     (&pAVar2->elementSize,
                      (int *)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_d8);
      tinyusdz::value::TimeCode::TimeCode
                ((TimeCode *)
                 &expanded_val.
                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(double)dest_local);
      bVar1 = tinyusdz::value::TimeCode::is_default
                        ((TimeCode *)
                         &expanded_val.
                          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        bVar1 = has_default_indices(this);
        if (bVar1) {
          ::std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)local_d8,&this->_indices);
        }
        else {
          bVar1 = has_timesampled_indices(this);
          if (bVar1) {
            TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::
            get<std::vector<int,_std::allocator<int>_>,_nullptr>
                      (&this->_ts_indices,(vector<int,_std::allocator<int>_> *)local_d8,
                       (double)dest_local,err_local._4_4_);
          }
        }
      }
      else {
        TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::
        get<std::vector<int,_std::allocator<int>_>,_nullptr>
                  (&this->_ts_indices,(vector<int,_std::allocator<int>_> *)local_d8,
                   (double)dest_local,err_local._4_4_);
      }
      ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::vector
                ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                 &ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value);
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::quath>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_120,
                 (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)local_b8
                 ,indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
                 (vector<int,_std::allocator<int>_> *)local_d8,
                 (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                 &ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value);
      bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_120);
      if (bVar1) {
        ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::operator=
                  (pvStack_28,
                   (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   &ret.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        this_local._7_1_ = 1;
        err_msg._4_4_ = 1;
      }
      else {
        local_130 = nonstd::expected_lite::
                    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_120);
        if (local_38 != (string *)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_170,"[Internal Error] Failed to expand for GeomPrimvar type = `{}`",
                     &local_171);
          Attribute::type_name_abi_cxx11_(&local_198,&this->_attr);
          fmt::format<std::__cxx11::string>
                    (local_150,(string *)local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198
                    );
          ::std::__cxx11::string::operator+=((string *)local_38,(string *)local_150);
          ::std::__cxx11::string::~string((string *)local_150);
          ::std::__cxx11::string::~string((string *)&local_198);
          ::std::__cxx11::string::~string(local_170);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_171);
          lVar3 = ::std::__cxx11::string::size();
          if (lVar3 != 0) {
            ::std::operator+((char *)local_1b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x9d0055);
            ::std::__cxx11::string::operator+=((string *)local_38,local_1b8);
            ::std::__cxx11::string::~string(local_1b8);
          }
        }
        err_msg._4_4_ = 0;
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_120);
      ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::~vector
                ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                 &ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value);
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_d8);
      if (err_msg._4_4_ == 0) goto LAB_00740fe6;
    }
    else {
      if (local_38 != (string *)0x0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1f8,"`{}[]` type requested, but Attribute is type `{}`",&local_1f9);
        tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
        Attribute::type_name_abi_cxx11_(&local_240,&this->_attr);
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_1d8,(fmt *)local_1f8,&local_220,&local_240,in_R8);
        ::std::__cxx11::string::operator+=((string *)local_38,(string *)&local_1d8);
        ::std::__cxx11::string::~string((string *)&local_1d8);
        ::std::__cxx11::string::~string((string *)&local_240);
        ::std::__cxx11::string::~string((string *)&local_220);
        ::std::__cxx11::string::~string(local_1f8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      }
LAB_00740fe6:
      err_msg._4_4_ = 0;
    }
    ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::~vector
              ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)local_b8);
    if (err_msg._4_4_ != 0) goto LAB_00741012;
  }
  this_local._7_1_ = 0;
LAB_00741012:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GeomPrimvar::flatten_with_indices(const double t, std::vector<T> *dest, const value::TimeSampleInterpolationType tinterp, std::string *err) const {
  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.has_timesamples() || _attr.has_value()) {

    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    std::vector<T> value;
    if (_attr.get_value<std::vector<T>>(t, &value, tinterp)) {

      uint32_t elementSize = _attr.metas().elementSize.value_or(1);

      // Get indices at specified time
      std::vector<int32_t> indices;
      if (value::TimeCode(t).is_default()) {
        if (has_default_indices()) {
          indices = _indices;
        } else if (has_timesampled_indices()) {
          _ts_indices.get(&indices, t, tinterp);
        }
      } else {
        _ts_indices.get(&indices, t, tinterp);
      }

      std::vector<T> expanded_val;
      auto ret = ExpandWithIndices(value, elementSize, indices, &expanded_val);
      if (ret) {
        (*dest) = expanded_val;
        // Currently we ignore ret.value()
        return true;
      } else {
        const std::string &err_msg = ret.error();
        if (err) {
          (*err) += fmt::format(
              "[Internal Error] Failed to expand for GeomPrimvar type = `{}`",
              _attr.type_name());
          if (err_msg.size()) {
            (*err) += "\n" + err_msg;
          }
        }
      }
    } else {
      if (err) {
        (*err) += fmt::format(
            "`{}[]` type requested, but Attribute is type `{}`",
            value::TypeTraits<T>::type_name(), _attr.type_name());
      }
    }
  } else {
    // TODO: Report error?
  }

  return false;
}